

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_update_buffer(sg_buffer buf_id,sg_range *data)

{
  _Bool _Var1;
  _sg_buffer_t *buf_00;
  _sg_buffer_t *buf;
  sg_range *data_local;
  sg_buffer buf_id_local;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3c51,"void sg_update_buffer(sg_buffer, const sg_range *)");
  }
  if (((data == (sg_range *)0x0) || (data->ptr == (void *)0x0)) || (data->size == 0)) {
    __assert_fail("data && data->ptr && (data->size > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                  ,0x3c52,"void sg_update_buffer(sg_buffer, const sg_range *)");
  }
  buf_00 = _sg_lookup_buffer(&_sg.pools,buf_id.id);
  if (((data->size != 0) && (buf_00 != (_sg_buffer_t *)0x0)) &&
     (((buf_00->slot).state == SG_RESOURCESTATE_VALID &&
      (_Var1 = _sg_validate_update_buffer(buf_00,data), _Var1)))) {
    if ((ulong)(long)(buf_00->cmn).size < data->size) {
      __assert_fail("data->size <= (size_t)buf->cmn.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c56,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((buf_00->cmn).update_frame_index == _sg.frame_index) {
      __assert_fail("buf->cmn.update_frame_index != _sg.frame_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c58,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    if ((buf_00->cmn).append_frame_index == _sg.frame_index) {
      __assert_fail("buf->cmn.append_frame_index != _sg.frame_index",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/sokol/sokol_gfx.h"
                    ,0x3c5a,"void sg_update_buffer(sg_buffer, const sg_range *)");
    }
    _sg_update_buffer(buf_00,data);
    (buf_00->cmn).update_frame_index = _sg.frame_index;
  }
  return;
}

Assistant:

inline void sg_update_buffer(sg_buffer buf_id, const sg_range& data) { return sg_update_buffer(buf_id, &data); }